

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::GeneratedMessageReflectionSwapTest_Extensions_Test::TestBody
          (GeneratedMessageReflectionSwapTest_Extensions_Test *this)

{
  Message *in_RCX;
  Metadata MVar1;
  TestAllExtensions lhs;
  TestAllExtensions rhs;
  undefined1 auStack_68 [48];
  TestAllExtensions local_38;
  
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)auStack_68,(Arena *)0x0);
  proto2_unittest::TestAllExtensions::TestAllExtensions
            ((TestAllExtensions *)(auStack_68 + 0x30),(Arena *)0x0);
  TestUtil::SetAllExtensions<proto2_unittest::TestAllExtensions>((TestAllExtensions *)auStack_68);
  MVar1 = proto2_unittest::TestAllExtensions::GetMetadata
                    ((TestAllExtensions *)proto2_unittest::_TestAllExtensions_default_instance_);
  GeneratedMessageReflectionSwapTest::Swap
            ((GeneratedMessageReflectionSwapTest *)MVar1.reflection,(Reflection *)auStack_68,
             (Message *)(auStack_68 + 0x30),in_RCX);
  TestUtil::ExpectExtensionsClear<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)auStack_68);
  TestUtil::ExpectAllExtensionsSet<proto2_unittest::TestAllExtensions>
            ((TestAllExtensions *)(auStack_68 + 0x30));
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)(auStack_68 + 0x30));
  proto2_unittest::TestAllExtensions::~TestAllExtensions((TestAllExtensions *)auStack_68);
  return;
}

Assistant:

TEST_P(GeneratedMessageReflectionSwapTest, Extensions) {
  unittest::TestAllExtensions lhs;
  unittest::TestAllExtensions rhs;

  TestUtil::SetAllExtensions(&lhs);

  Swap(lhs.GetReflection(), &lhs, &rhs);

  TestUtil::ExpectExtensionsClear(lhs);
  TestUtil::ExpectAllExtensionsSet(rhs);
}